

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_printf.cpp
# Opt level: O1

ostream * ostream_printf(ostream *stream,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *__s;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  pair<char_*,_long> pVar3;
  va_list vl;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pVar3 = std::get_temporary_buffer<char>(0x80);
  sVar2 = pVar3.second;
  __s = pVar3.first;
  if (0 < (long)sVar2) {
    local_f8 = local_e8;
    local_100 = &vl[0].overflow_arg_area;
    local_108 = 0x3000000010;
    iVar1 = vsnprintf(__s,sVar2,fmt,&local_108);
    if ((long)sVar2 <= (long)iVar1) {
      operator_delete(__s);
      pVar3 = std::get_temporary_buffer<char>((long)(iVar1 + 1));
      __s = pVar3.first;
      if (pVar3.second < 1) {
        return stream;
      }
      local_f8 = local_e8;
      local_100 = &vl[0].overflow_arg_area;
      local_108 = 0x3000000010;
      vsnprintf(__s,pVar3.second,fmt,&local_108);
    }
    if (__s == (char *)0x0) {
      std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar2);
    }
    operator_delete(__s);
  }
  return stream;
}

Assistant:

std::ostream& ostream_printf(std::ostream& stream, const char* fmt, ...) {
	auto buffer = std::get_temporary_buffer<char>(DEFAULT_SIZE);
	if (buffer.second > 0) {
		va_list vl;
		va_start(vl, fmt);
		auto actual_size = vsnprintf(buffer.first, buffer.second, fmt, vl);
		if (buffer.second <= actual_size) {
			std::return_temporary_buffer(buffer.first);
			buffer = std::get_temporary_buffer<char>(actual_size + 1);
			if (buffer.second > 0) {
				va_start(vl, fmt);
				vsnprintf(buffer.first, buffer.second, fmt, vl);
				stream << buffer.first;
				std::return_temporary_buffer(buffer.first);
			}
		}
		else {
			stream << buffer.first;
			std::return_temporary_buffer(buffer.first);
		}
	}
	return stream;
}